

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::MthdD3D56Config::is_valid_val(MthdD3D56Config *this)

{
  uint uVar1;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((((-1 < (short)uVar1) && ((ulong)(uVar1 >> 8 & 0xf) - 1 < 8)) && ((uVar1 & 0x300000) != 0)) &&
     ((0xfffffffffffffff7 < (ulong)(uVar1 >> 0x10 & 0xf) - 9 &&
      (((uVar1 & 0x3e000000) == 0 || ((this->super_SingleMthdTest).super_MthdTest.cls != 0x54))))))
  {
    return SUB41(uVar1 + 0x40000000 >> 0x1f,0);
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 8, 4) < 1 || extr(val, 8, 4) > 8)
			return false;
		if (extr(val, 15, 1))
			return false;
		if (extr(val, 16, 4) < 1 || extr(val, 16, 4) > 8)
			return false;
		if (extr(val, 20, 2) < 1)
			return false;
		if (extr(val, 25, 5) && cls == 0x54)
			return false;
		if (extr(val, 30, 2) < 1 || extr(val, 30, 2) > 2)
			return false;
		return true;
	}